

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::Hashing::hash_reference_base(Hasher *h,VkAttachmentReference2 *ref)

{
  bool bVar1;
  ulong uVar2;
  
  uVar2 = h->h * 0x100000001b3 ^ (ulong)ref->attachment;
  h->h = uVar2;
  uVar2 = uVar2 * 0x100000001b3 ^ (ulong)ref->layout;
  h->h = uVar2;
  h->h = uVar2 * 0x100000001b3 ^ (ulong)ref->aspectMask;
  bVar1 = hash_pnext_chain((StateRecorder *)0x0,h,ref->pNext,(DynamicStateInfo *)0x0,0);
  return bVar1;
}

Assistant:

static bool hash_reference_base(Hasher &h, const VkAttachmentReference2 &ref)
{
	h.u32(ref.attachment);
	h.u32(ref.layout);
	h.u32(ref.aspectMask);
	return hash_pnext_chain(nullptr, h, ref.pNext, nullptr, 0);
}